

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O3

UChar * icu_63::ZoneMeta::findMetaZoneID(UnicodeString *mzid)

{
  UBool UVar1;
  UChar *pUVar2;
  
  if (gMetaZoneIDsInitOnce.fState.super___atomic_base<int>._M_i != 2) {
    UVar1 = umtx_initImplPreInit(&gMetaZoneIDsInitOnce);
    if (UVar1 != '\0') {
      initAvailableMetaZoneIDs();
      umtx_initImplPostInit(&gMetaZoneIDsInitOnce);
    }
  }
  if (gMetaZoneIDTable != (UHashtable *)0x0) {
    pUVar2 = (UChar *)uhash_get_63(gMetaZoneIDTable,mzid);
    return pUVar2;
  }
  return (UChar *)0x0;
}

Assistant:

const UChar*
ZoneMeta::findMetaZoneID(const UnicodeString& mzid) {
    umtx_initOnce(gMetaZoneIDsInitOnce, &initAvailableMetaZoneIDs);
    if (gMetaZoneIDTable == NULL) {
        return NULL;
    }
    return (const UChar*)uhash_get(gMetaZoneIDTable, &mzid);
}